

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputQuoted(ostream *out,string *name)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  
  bVar2 = std::operator==(name,"exp");
  if (((((bVar2) || (bVar2 = std::operator==(name,"log"), bVar2)) ||
       (bVar2 = std::operator==(name,"cos"), bVar2)) ||
      ((bVar2 = std::operator==(name,"sin"), bVar2 || (bVar2 = std::operator==(name,"tan"), bVar2)))
      ) || ((bVar2 = std::operator==(name,"sqrt"), bVar2 ||
            (bVar2 = std::operator==(name,"const"), bVar2)))) {
    out = std::operator<<(out,"_");
  }
  else {
    cVar1 = *(name->_M_dataplus)._M_p;
    if ((cVar1 == '\'') || (cVar1 == '$')) {
      poVar3 = std::operator<<(out,'|');
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::operator<<(poVar3,"|");
      return;
    }
  }
  std::operator<<(out,(string *)name);
  return;
}

Assistant:

static void outputQuoted(std::ostream& out, std::string const& name) 
  {
    if (   name == "exp"
        || name == "log"
        || name == "cos"
        || name == "sin"
        || name == "tan"
        || name == "sqrt"
        || name == "const"
        ) {
        out << "_" << name;
    } else if ( name[0] == '\'' || name[0] == '$') {
      // add one more level of quoting
      out << '|' << name << "|";
    } else  {
      out << name;
    }
  }